

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::ARITH_OP(SQVM *this,SQUnsignedInteger op,SQObjectPtr *trg,SQObjectPtr *o1,SQObjectPtr *o2)

{
  SQTable *pSVar1;
  bool bVar2;
  SQObjectType SVar3;
  SQObjectPtr *in_RCX;
  SQObjectPtr *in_RDX;
  SQObjectPtr *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr *in_R8;
  SQFloat SVar4;
  SQFloat SVar5;
  SQFloat f2;
  SQFloat f1;
  SQFloat res_1;
  SQInteger i2;
  SQInteger i1;
  SQInteger res;
  SQInteger tmask;
  SQInteger in_stack_ffffffffffffff78;
  long lVar6;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  SVar3 = (in_RCX->super_SQObject)._type | (in_R8->super_SQObject)._type;
  if (SVar3 == OT_INTEGER) {
    pSVar1 = (in_R8->super_SQObject)._unVal.pTable;
    switch(in_RSI) {
    case (SQObjectPtr *)0x25:
      if (pSVar1 == (SQTable *)0x0) {
        Raise_Error(in_RDI,"modulo by zero");
        return false;
      }
      break;
    default:
      break;
    case (SQObjectPtr *)0x2a:
      break;
    case (SQObjectPtr *)0x2b:
      break;
    case (SQObjectPtr *)0x2d:
      break;
    case (SQObjectPtr *)0x2f:
      if (pSVar1 == (SQTable *)0x0) {
        Raise_Error(in_RDI,"division by zero");
        return false;
      }
      if ((pSVar1 == (SQTable *)0xffffffffffffffff) &&
         ((in_RCX->super_SQObject)._unVal.pTable == (SQTable *)0xffffffff80000000)) {
        Raise_Error(in_RDI,"integer overflow");
        return false;
      }
    }
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
  }
  else if ((SVar3 == OT_FLOAT) || (SVar3 == 0x5000006)) {
    if ((in_RCX->super_SQObject)._type == OT_INTEGER) {
      SVar4 = (SQFloat)(in_RCX->super_SQObject)._unVal.nInteger;
    }
    else {
      SVar4 = (in_RCX->super_SQObject)._unVal.fFloat;
    }
    if ((in_R8->super_SQObject)._type == OT_INTEGER) {
      SVar5 = (SQFloat)(in_R8->super_SQObject)._unVal.nInteger;
    }
    else {
      SVar5 = (in_R8->super_SQObject)._unVal.fFloat;
    }
    lVar6 = (long)&in_RSI[-3].super_SQObject._unVal.pTable + 3;
    switch(lVar6) {
    case 0:
      fmod((double)SVar4,(double)SVar5);
      break;
    default:
      break;
    case 5:
      break;
    case 6:
      break;
    case 8:
      break;
    case 10:
    }
    ::SQObjectPtr::operator=((SQObjectPtr *)CONCAT44(SVar4,SVar5),(SQFloat)((ulong)lVar6 >> 0x20));
  }
  else if ((in_RSI == (SQObjectPtr *)0x2b) && ((SVar3 & 0x10) != 0)) {
    bVar2 = StringCat((SQVM *)0x2b,in_RDX,in_RCX,in_R8);
    if (!bVar2) {
      return false;
    }
  }
  else {
    bVar2 = ArithMetaMethod((SQVM *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                            (SQInteger)in_RDI,in_RSI,in_RDX,in_RCX);
    if (!bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SQVM::ARITH_OP(SQUnsignedInteger op,SQObjectPtr &trg,const SQObjectPtr &o1,const SQObjectPtr &o2)
{
    SQInteger tmask = sq_type(o1)| sq_type(o2);
    switch(tmask) {
        case OT_INTEGER:{
            SQInteger res, i1 = _integer(o1), i2 = _integer(o2);
            switch(op) {
            case '+': res = i1 + i2; break;
            case '-': res = i1 - i2; break;
            case '/': if (i2 == 0) { Raise_Error(_SC("division by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { Raise_Error(_SC("integer overflow")); return false; }
                    res = i1 / i2;
                    break;
            case '*': res = i1 * i2; break;
            case '%': if (i2 == 0) { Raise_Error(_SC("modulo by zero")); return false; }
                    else if (i2 == -1 && i1 == INT_MIN) { res = 0; break; }
                    res = i1 % i2;
                    break;
            default: res = 0xDEADBEEF;
            }
            trg = res; }
            break;
        case (OT_FLOAT|OT_INTEGER):
        case (OT_FLOAT):{
            SQFloat res, f1 = tofloat(o1), f2 = tofloat(o2);
            switch(op) {
            case '+': res = f1 + f2; break;
            case '-': res = f1 - f2; break;
            case '/': res = f1 / f2; break;
            case '*': res = f1 * f2; break;
            case '%': res = SQFloat(fmod((double)f1,(double)f2)); break;
            default: res = 0x0f;
            }
            trg = res; }
            break;
        default:
            if(op == '+' && (tmask & _RT_STRING)){
                if(!StringCat(o1, o2, trg)) return false;
            }
            else if(!ArithMetaMethod(op,o1,o2,trg)) {
                return false;
            }
    }
    return true;
}